

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCore.c
# Opt level: O3

int Lpk_ResynthesizeNodeNew(Lpk_Man_t *p)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  Vec_Ptr_t *pVVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  undefined4 extraout_var;
  void **ppvVar10;
  uint *pTruth;
  Vec_Ptr_t *pVVar11;
  Abc_Obj_t *pObjNew;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  Lpk_Cut_t *pCut;
  timespec ts;
  
  iVar6 = Abc_ObjRequiredLevel(p->pObj);
  iVar7 = clock_gettime(3,(timespec *)&ts);
  if (iVar7 < 0) {
    lVar13 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  iVar7 = Lpk_NodeCuts(p);
  if (iVar7 == 0) {
    iVar6 = clock_gettime(3,(timespec *)&ts);
    if (iVar6 < 0) {
      lVar14 = -1;
    }
    else {
      lVar14 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    p->timeCuts = p->timeCuts + lVar14 + lVar13;
    iVar7 = 0;
  }
  else {
    iVar7 = clock_gettime(3,(timespec *)&ts);
    if (iVar7 < 0) {
      lVar14 = -1;
    }
    else {
      lVar14 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    p->timeCuts = p->timeCuts + lVar14 + lVar13;
    if (p->pPars->fVeryVerbose != 0) {
      printf("Node %5d : Mffc size = %5d. Cuts = %5d.  Level = %2d. Req = %2d.\n",
             (ulong)(uint)p->pObj->Id,(ulong)(uint)p->nMffc,(ulong)(uint)p->nEvals,
             (ulong)(*(uint *)&p->pObj->field_0x14 >> 0xc),CONCAT44(extraout_var,iVar6));
    }
    p->nCutsTotal = p->nCutsTotal + p->nCuts;
    p->nCutsUseful = p->nCutsUseful + p->nEvals;
    iVar7 = 1;
    if (0 < p->nEvals) {
      lVar13 = 0;
      do {
        if ((lVar13 == 1) && (p->pPars->fFirst != 0)) break;
        pCut = p->pCuts + p->pEvals[lVar13];
        if ((undefined1  [212])((undefined1  [212])*pCut & (undefined1  [212])0x3f) !=
            (undefined1  [212])0x0) {
          pVVar11 = p->pNtk->vObjs;
          uVar12 = 0;
          do {
            iVar7 = pCut->pLeaves[uVar12];
            if (((long)iVar7 < 0) || (pVVar11->nSize <= iVar7)) goto LAB_00470752;
            piVar1 = (int *)((long)pVVar11->pArray[iVar7] + 0x2c);
            *piVar1 = *piVar1 + 1;
            uVar12 = uVar12 + 1;
          } while (uVar12 < (*(uint *)pCut & 0x3f));
        }
        iVar7 = Abc_NodeMffcLabel(p->pObj);
        uVar16 = *(uint *)pCut;
        if ((uVar16 & 0x3f) != 0) {
          pVVar11 = p->pNtk->vObjs;
          uVar12 = 0;
          do {
            iVar9 = pCut->pLeaves[uVar12];
            if (((long)iVar9 < 0) || (pVVar11->nSize <= iVar9)) goto LAB_00470752;
            piVar1 = (int *)((long)pVVar11->pArray[iVar9] + 0x2c);
            *piVar1 = *piVar1 + -1;
            uVar12 = uVar12 + 1;
            uVar16 = *(uint *)pCut;
          } while (uVar12 < (uVar16 & 0x3f));
        }
        if (iVar7 == (uVar16 >> 6 & 0x3f) - (uVar16 >> 0xc & 0x3f)) {
          p->vLeaves->nSize = 0;
          if ((undefined1  [212])((undefined1  [212])*pCut & (undefined1  [212])0x3f) !=
              (undefined1  [212])0x0) {
            uVar12 = 0;
            do {
              iVar7 = pCut->pLeaves[uVar12];
              if (((long)iVar7 < 0) || (pVVar11 = p->pNtk->vObjs, pVVar11->nSize <= iVar7)) {
LAB_00470752:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              pVVar4 = p->vLeaves;
              pvVar5 = pVVar11->pArray[iVar7];
              uVar16 = pVVar4->nSize;
              if (uVar16 == pVVar4->nCap) {
                if ((int)uVar16 < 0x10) {
                  if (pVVar4->pArray == (void **)0x0) {
                    ppvVar10 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar10 = (void **)realloc(pVVar4->pArray,0x80);
                  }
                  pVVar4->pArray = ppvVar10;
                  pVVar4->nCap = 0x10;
                }
                else {
                  if (pVVar4->pArray == (void **)0x0) {
                    ppvVar10 = (void **)malloc((ulong)uVar16 << 4);
                  }
                  else {
                    ppvVar10 = (void **)realloc(pVVar4->pArray,(ulong)uVar16 << 4);
                  }
                  pVVar4->pArray = ppvVar10;
                  pVVar4->nCap = uVar16 * 2;
                }
              }
              else {
                ppvVar10 = pVVar4->pArray;
              }
              iVar7 = pVVar4->nSize;
              pVVar4->nSize = iVar7 + 1;
              ppvVar10[iVar7] = pvVar5;
              uVar12 = uVar12 + 1;
            } while (uVar12 < (*(uint *)pCut & 0x3f));
          }
          iVar7 = clock_gettime(3,(timespec *)&ts);
          if (iVar7 < 0) {
            lVar14 = 1;
          }
          else {
            lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
            lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + ts.tv_sec * -1000000;
          }
          pTruth = Lpk_CutTruth(p,pCut,0);
          iVar7 = clock_gettime(3,(timespec *)&ts);
          if (iVar7 < 0) {
            lVar15 = -1;
          }
          else {
            lVar15 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          p->timeTruth = p->timeTruth + lVar15 + lVar14;
          iVar7 = clock_gettime(3,(timespec *)&ts);
          if (iVar7 < 0) {
            lVar14 = 1;
          }
          else {
            lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
            lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + ts.tv_sec * -1000000;
          }
          Lpk_ComputeSupports(p,pCut,pTruth);
          iVar7 = clock_gettime(3,(timespec *)&ts);
          if (iVar7 < 0) {
            lVar15 = -1;
          }
          else {
            lVar15 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          p->timeSupps = p->timeSupps + lVar15 + lVar14;
          if (p->pPars->fVeryVerbose != 0) {
            uVar8 = Extra_TruthSupportSize(pTruth,*(uint *)pCut & 0x3f);
            uVar16 = *(uint *)pCut;
            printf("  C%02d: L= %2d/%2d  V= %2d/%d  N= %d  W= %4.2f  ",(double)pCut->Weight,lVar13,
                   (ulong)(uVar16 & 0x3f),(ulong)uVar8,(ulong)(uVar16 >> 6 & 0x3f),
                   (ulong)(uVar16 >> 0xc & 0x3f),(ulong)(uVar16 >> 0x12 & 0x3f));
            pVVar11 = p->vLeaves;
            if (0 < pVVar11->nSize) {
              lVar14 = 0;
              do {
                printf("%c=%d ",(ulong)((int)lVar14 + 0x61),
                       (ulong)(*(uint *)((long)pVVar11->pArray[lVar14] + 0x14) >> 0xc));
                lVar14 = lVar14 + 1;
                pVVar11 = p->vLeaves;
              } while (lVar14 < pVVar11->nSize);
            }
            putchar(10);
            Kit_DsdPrintFromTruth(pTruth,*(uint *)pCut & 0x3f);
          }
          iVar7 = p->pNtk->nObjCounts[7];
          iVar9 = clock_gettime(3,(timespec *)&ts);
          if (iVar9 < 0) {
            lVar14 = 1;
          }
          else {
            lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
            lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + ts.tv_sec * -1000000;
          }
          pObjNew = Lpk_Decompose(p,p->pNtk,p->vLeaves,pTruth,p->puSupps,p->pPars->nLutSize,
                                  (uint)(0 < p->pPars->fZeroCost) +
                                  (~*(uint *)pCut >> 0xc | 0xffffffc0) + (*(uint *)pCut >> 6 & 0x3f)
                                  ,iVar6);
          iVar9 = clock_gettime(3,(timespec *)&ts);
          if (iVar9 < 0) {
            lVar15 = -1;
          }
          else {
            lVar15 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          p->timeEval = p->timeEval + lVar15 + lVar14;
          if (pObjNew != (Abc_Obj_t *)0x0) {
            uVar16 = (iVar7 - p->pNtk->nObjCounts[7]) +
                     ((*(uint *)pCut >> 6 & 0x3f) - (*(uint *)pCut >> 0xc & 0x3f));
            if ((int)uVar16 < 1 - p->pPars->fZeroCost) {
              __assert_fail("nGain >= 1 - p->pPars->fZeroCost",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCore.c"
                            ,0x1d6,"int Lpk_ResynthesizeNodeNew(Lpk_Man_t *)");
            }
            if (iVar6 < (int)(*(uint *)&pObjNew->field_0x14 >> 0xc)) {
              __assert_fail("Abc_ObjLevel(pObjNew) <= Required",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCore.c"
                            ,0x1d7,"int Lpk_ResynthesizeNodeNew(Lpk_Man_t *)");
            }
            uVar2 = p->nGainTotal;
            uVar3 = p->nChanges;
            p->nGainTotal = uVar16 + uVar2;
            p->nChanges = uVar3 + 1;
            if (p->pPars->fVeryVerbose != 0) {
              printf("Performed resynthesis: Gain = %2d. Level = %2d. Req = %2d.\n",(ulong)uVar16,
                     (ulong)(*(uint *)&pObjNew->field_0x14 >> 0xc),CONCAT44(extraout_var,iVar6));
            }
            Abc_NtkUpdate(p->pObj,pObjNew,p->vLevels);
            break;
          }
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < p->nEvals);
      iVar7 = 1;
    }
  }
  return iVar7;
}

Assistant:

int Lpk_ResynthesizeNodeNew( Lpk_Man_t * p )
{
//    static int Count = 0;
    Abc_Obj_t * pObjNew, * pLeaf;
    Lpk_Cut_t * pCut;
    unsigned * pTruth;
    int nNodesBef, nNodesAft, nCutNodes;
    int i, k;
    abctime clk;
    int Required = Abc_ObjRequiredLevel(p->pObj);
//    CloudNode * pFun2;//, * pFun1;

    // compute the cuts
clk = Abc_Clock();
    if ( !Lpk_NodeCuts( p ) )
    {
p->timeCuts += Abc_Clock() - clk;
        return 0;
    }
p->timeCuts += Abc_Clock() - clk;

    if ( p->pPars->fVeryVerbose )
        printf( "Node %5d : Mffc size = %5d. Cuts = %5d.  Level = %2d. Req = %2d.\n", 
            p->pObj->Id, p->nMffc, p->nEvals, p->pObj->Level, Required );
    // try the good cuts
    p->nCutsTotal  += p->nCuts;
    p->nCutsUseful += p->nEvals;
    for ( i = 0; i < p->nEvals; i++ )
    {
        // get the cut
        pCut = p->pCuts + p->pEvals[i];
        if ( p->pPars->fFirst && i == 1 )
            break;
//        if ( pCut->Weight < 1.05 )
//            continue;

        // skip bad cuts        
//        printf( "Mffc size = %d.  ", Abc_NodeMffcLabel(p->pObj) );
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Abc_NtkObj(p->pNtk, pCut->pLeaves[k])->vFanouts.nSize++;
        nCutNodes = Abc_NodeMffcLabel(p->pObj);
//        printf( "Mffc with cut = %d.  ", nCutNodes );
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Abc_NtkObj(p->pNtk, pCut->pLeaves[k])->vFanouts.nSize--;
//        printf( "Mffc cut = %d.  ", (int)pCut->nNodes - (int)pCut->nNodesDup );
//        printf( "\n" );
        if ( nCutNodes != (int)pCut->nNodes - (int)pCut->nNodesDup )
            continue;

        // collect nodes into the array
        Vec_PtrClear( p->vLeaves );
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Vec_PtrPush( p->vLeaves, Abc_NtkObj(p->pNtk, pCut->pLeaves[k]) );

        // compute the truth table
clk = Abc_Clock();
        pTruth = Lpk_CutTruth( p, pCut, 0 );
p->timeTruth += Abc_Clock() - clk;
clk = Abc_Clock();
        Lpk_ComputeSupports( p, pCut, pTruth );        
p->timeSupps += Abc_Clock() - clk;
//clk = Abc_Clock();
//        pFun1 = Lpk_CutTruthBdd( p, pCut );
//p->timeTruth2 += Abc_Clock() - clk;
/*
clk = Abc_Clock();
        Cloud_Restart( p->pDsdMan->dd );
        pFun2 = Kit_TruthToCloud( p->pDsdMan->dd, pTruth, pCut->nLeaves );
        RetValue = Kit_CreateCloud( p->pDsdMan->dd, pFun2, p->vBddNodes );
p->timeTruth3 += Abc_Clock() - clk;
*/
//        if ( pFun1 != pFun2 )
//            printf( "Truth tables do not agree!\n" );
//        else
//            printf( "Fine!\n" );

        if ( p->pPars->fVeryVerbose )
        {
//            char * pFileName;
            int nSuppSize = Extra_TruthSupportSize( pTruth, pCut->nLeaves );
            printf( "  C%02d: L= %2d/%2d  V= %2d/%d  N= %d  W= %4.2f  ", 
                i, pCut->nLeaves, nSuppSize, pCut->nNodes, pCut->nNodesDup, pCut->nLuts, pCut->Weight );
            Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pLeaf, k )
                printf( "%c=%d ", 'a'+k, Abc_ObjLevel(pLeaf) );
            printf( "\n" );
            Kit_DsdPrintFromTruth( pTruth, pCut->nLeaves );
//            pFileName = Kit_TruthDumpToFile( pTruth, pCut->nLeaves, Count++ );
//            printf( "Saved truth table in file \"%s\".\n", pFileName );
        }

        // update the network
        nNodesBef = Abc_NtkNodeNum(p->pNtk);
clk = Abc_Clock();
        pObjNew = Lpk_Decompose( p, p->pNtk, p->vLeaves, pTruth, p->puSupps, p->pPars->nLutSize,
            (int)pCut->nNodes - (int)pCut->nNodesDup - 1 + (int)(p->pPars->fZeroCost > 0), Required );
p->timeEval += Abc_Clock() - clk;
        nNodesAft = Abc_NtkNodeNum(p->pNtk);

        // perform replacement
        if ( pObjNew )
        {
            int nGain = (int)pCut->nNodes - (int)pCut->nNodesDup - (nNodesAft - nNodesBef);
            assert( nGain >= 1 - p->pPars->fZeroCost );
            assert( Abc_ObjLevel(pObjNew) <= Required );
/*
            if ( nGain <= 0 )
            {
                int x = 0;
            }
            if ( Abc_ObjLevel(pObjNew) > Required )
            {
                int x = 0;
            }
*/
            p->nGainTotal += nGain;
            p->nChanges++;
            if ( p->pPars->fVeryVerbose )
                printf( "Performed resynthesis: Gain = %2d. Level = %2d. Req = %2d.\n", nGain, Abc_ObjLevel(pObjNew), Required );
            Abc_NtkUpdate( p->pObj, pObjNew, p->vLevels );
//printf( "%3d : %d-%d=%d(%d) \n", p->nChanges, nNodesBef, Abc_NtkNodeNum(p->pNtk), nNodesBef-Abc_NtkNodeNum(p->pNtk), nGain );
            break;
        }
    }
    return 1;
}